

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

int __thiscall FIX::DateTime::getWeekDay(DateTime *this)

{
  int iVar1;
  int local_44;
  int local_38;
  int wd;
  int c;
  int y;
  int Yprime;
  int m;
  int D;
  int M;
  int Y;
  DateTime *this_local;
  
  _M = this;
  getYMD(this,&D,&m,&Yprime);
  if (m < 3) {
    iVar1 = m + 10;
    local_38 = D + -1;
  }
  else {
    iVar1 = m + -2;
    local_38 = D;
  }
  local_44 = (Yprime + (int)((double)iVar1 * 2.6 + -0.2) + local_38 % 100 + (local_38 % 100) / 4 +
              (local_38 / 100) / 4 + (local_38 / 100) * -2) % 7;
  if (local_44 < 0) {
    local_44 = local_44 + 7;
  }
  return local_44 + 1;
}

Assistant:

inline int getWeekDay() const 
  {
    int Y, M, D;
    getYMD (Y, M, D);
    int m = M >= 3 ? M - 2 : M + 10;
    int Yprime = M >= 3 ? Y : Y - 1;
    int y = Yprime % 100;
    int c = Yprime / 100;
    int wd = (D + int (2.6 * m - 0.2) + y + int (y / 4) + int (c / 4) -
              (2 * c)) % 7;
    return 1 + (wd < 0 ? 7 + wd : wd);
  }